

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNInlineObject * CTcPrsOpUnary::parse_inline_object(int has_colon)

{
  CTPNSuperclassList *sclist;
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNInlineObject *pCVar3;
  size_t in_RSI;
  int err;
  tcprs_term_info outer_term;
  
  pCVar3 = (CTPNInlineObject *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x58,in_RSI);
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.last_ = (CTPNObjProp *)0x0;
  *(undefined8 *)&(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.cnt_ = 0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.obj_sym_ = (CTcSymObj *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.first_ = (CTPNObjProp *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.dst_ = (CTPNObjProp **)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.head_ = (CTPNSuperclass *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.tail_ = (CTPNSuperclass *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.dst_ = (CTPNSuperclass **)0x0;
  *(undefined8 *)&(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.field_0x48 = 0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef._vptr_CTPNObjDef = (_func_int **)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.first_ = (CTPNObjProp *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.last_ = (CTPNObjProp *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.dst_ =
       &(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.first_;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.cnt_ = 0;
  sclist = &(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.head_ = (CTPNSuperclass *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.tail_ = (CTPNSuperclass *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.dst_ = &sclist->head_;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.obj_sym_ = (CTcSymObj *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.field_0x48 = 0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_00323a68;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef._vptr_CTPNObjDef =
       (_func_int **)&PTR_is_inline_object_00323b58;
  if (has_colon == 0) {
    tVar1 = CTcTokenizer::next(G_tok);
    if (tVar1 != TOKT_COLON) goto LAB_002086c2;
    CTcTokenizer::next(G_tok);
  }
  CTcParser::parse_superclass_list(G_prs,(CTcSymObj *)0x0,sclist);
LAB_002086c2:
  if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
    CTcTokenizer::next(G_tok);
    err = 0;
    iVar2 = CTcParser::parse_obj_prop_list
                      (G_prs,&err,&(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef,
                       (CTcSymMetaclass *)0x0,0,0,1,1,&outer_term,&outer_term);
    if (iVar2 == 0) {
      pCVar3 = (CTPNInlineObject *)0x0;
    }
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2be4);
    pCVar3 = (CTPNInlineObject *)0x0;
  }
  return pCVar3;
}

Assistant:

class CTPNInlineObject *CTcPrsOpUnary::parse_inline_object(int has_colon)
{
    /* create the inline object node */
    CTPNInlineObject *obj = new CTPNInlineObject();

    /* if the caller didn't already check for a colon, do so now */
    if (!has_colon && G_tok->next() == TOKT_COLON)
    {
        /* note and skip the colon */
        has_colon = TRUE;
        G_tok->next();
    }

    /* if there's a colon, parse the superclass list */
    if (has_colon)
        G_prs->parse_superclass_list(0, obj->get_superclass_list());

    /* next we need a left brace '{' */
    if (G_tok->cur() != TOKT_LBRACE)
    {
        G_tok->log_error_curtok(TCERR_INLINE_OBJ_REQ_LBRACE);
        return 0;
    }

    /* skip the brace */
    G_tok->next();

    /* parse the property list */
    int err = FALSE;
    tcprs_term_info outer_term;
    if (!G_prs->parse_obj_prop_list(
        &err, obj, 0, FALSE, FALSE, TRUE, TRUE, &outer_term, &outer_term))
        return 0;

    /* return the object node */
    return obj;
}